

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecWrd.h
# Opt level: O0

Vec_Wrd_t * Vec_WrdStartRandom(int nSize)

{
  Vec_Wrd_t *pVVar1;
  word wVar2;
  int local_1c;
  int i;
  Vec_Wrd_t *vSims;
  int nSize_local;
  
  pVVar1 = Vec_WrdStart(nSize);
  for (local_1c = 0; local_1c < nSize; local_1c = local_1c + 1) {
    wVar2 = Abc_RandomW(0);
    pVVar1->pArray[local_1c] = wVar2;
  }
  return pVVar1;
}

Assistant:

static inline Vec_Wrd_t * Vec_WrdStartRandom( int nSize )
{
    Vec_Wrd_t * vSims = Vec_WrdStart( nSize ); int i;
    for ( i = 0; i < nSize; i++ )
        vSims->pArray[i] = Abc_RandomW(0);
    return vSims;
}